

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O1

idx_t duckdb::ConstantRegexpStringSplit::Find
                (char *input_data,idx_t input_size,char *delim_data,idx_t delim_size,
                idx_t *match_size,void *data)

{
  bool bVar1;
  idx_t iVar2;
  StringPiece match;
  StringPiece local_38;
  StringPiece local_20;
  
  local_38.data_ = (const_pointer)0x0;
  local_38.size_ = 0;
  local_20.data_ = input_data;
  local_20.size_ = input_size;
  bVar1 = duckdb_re2::RE2::Match((RE2 *)data,&local_20,0,input_size,UNANCHORED,&local_38,1);
  iVar2 = 0xffffffffffffffff;
  if (bVar1) {
    *match_size = local_38.size_;
    iVar2 = (long)local_38.data_ - (long)input_data;
  }
  return iVar2;
}

Assistant:

static idx_t Find(const char *input_data, idx_t input_size, const char *delim_data, idx_t delim_size,
	                  idx_t &match_size, void *data) {
		D_ASSERT(data);
		auto regex = reinterpret_cast<duckdb_re2::RE2 *>(data);
		duckdb_re2::StringPiece match;
		if (!regex->Match(duckdb_re2::StringPiece(input_data, input_size), 0, input_size, RE2::UNANCHORED, &match, 1)) {
			return DConstants::INVALID_INDEX;
		}
		match_size = match.size();
		return UnsafeNumericCast<idx_t>(match.data() - input_data);
	}